

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_location_handler.c
# Opt level: O3

cio_http_cb_return handle_field_value(cio_http_client *client,char *at,size_t length)

{
  byte bVar1;
  cio_http_location_handler *pcVar2;
  cio_http_cb_t p_Var3;
  cio_http_data_cb_t p_Var4;
  char *__s;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  cio_http_cb_return cVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  ulong uVar14;
  byte *__s2;
  cio_http_data_cb_t p_Var15;
  byte *pbVar16;
  bool bVar17;
  bool bVar18;
  
  pcVar2 = client->current_handler;
  bVar13 = *(byte *)&pcVar2[1].on_message_complete;
  cVar9 = (uint)bVar13 & 3;
  switch(cVar9) {
  case CIO_HTTP_CB_SUCCESS:
    goto switchD_001039b9_caseD_0;
  case CIO_HTTP_CB_SKIP_BODY:
    if (length != 0x18) goto LAB_00103c16;
    pcVar2[1].on_port = *(cio_http_data_cb_t *)(at + 0x10);
    p_Var4 = *(cio_http_data_cb_t *)(at + 8);
    pcVar2[1].on_schema = *(cio_http_data_cb_t *)at;
    pcVar2[1].on_host = p_Var4;
    pcVar2[1].on_path = (cio_http_data_cb_t)0x3541464145383532;
    pcVar2[1].on_query = (cio_http_data_cb_t)0x37342d343139452d;
    pcVar2[1].on_fragment = (cio_http_data_cb_t)0x2d414335392d4144;
    pcVar2[1].on_header_field_name = (cio_http_data_cb_t)0x3843443042413543;
    *(undefined4 *)&pcVar2[1].on_header_field_value = 0x31314235;
    break;
  case 2:
    if (length == 2) {
      bVar1 = bVar13 | 8;
      if (*(short *)at != 0x3331) {
        bVar1 = bVar13;
      }
      cVar9 = -(uint)(*(short *)at != 0x3331);
      bVar13 = bVar1;
      goto switchD_001039b9_caseD_0;
    }
LAB_00103c16:
    cVar9 = CIO_HTTP_CB_ERROR;
    goto switchD_001039b9_caseD_0;
  case 3:
    bVar13 = bVar13 | 4;
    *(byte *)&pcVar2[1].on_message_complete = bVar13;
    p_Var3 = pcVar2[1].on_headers_complete;
    pbVar16 = (byte *)at;
    sVar8 = length;
    if (p_Var3 != (cio_http_cb_t)0x0) {
joined_r0x00103a5b:
      do {
        if (length == 0) {
          pbVar16 = (byte *)0x0;
        }
        else if (*pbVar16 != 0x2c) {
          length = length - 1;
          pbVar16 = pbVar16 + 1;
          goto joined_r0x00103a5b;
        }
        uVar12 = (long)pbVar16 - (long)at;
        if (pbVar16 == (byte *)0x0) {
          uVar12 = sVar8;
        }
        cVar9 = CIO_HTTP_CB_ERROR;
        __s2 = (byte *)at;
        uVar14 = uVar12;
        uVar6 = uVar12;
        while( true ) {
          if (uVar14 == 0) goto switchD_001039b9_caseD_0;
          uVar6 = uVar6 - 1;
          bVar1 = *__s2;
          if ((bVar1 != 0x20) && (bVar1 != 9)) break;
          __s2 = __s2 + 1;
          uVar14 = uVar14 - 1;
        }
        for (lVar10 = 0;
            (((byte *)at)[lVar10 + (uVar12 - 1)] == 0x20 ||
            (((byte *)at)[lVar10 + (uVar12 - 1)] == 9)); lVar10 = lVar10 + -1) {
          uVar6 = uVar6 - 1;
        }
        uVar14 = uVar14 + lVar10;
        if (uVar14 != 0) {
          if (((byte)(bVar1 + 0x81) < 0xa2) || ((bVar1 & 0x7c) == 0x3c))
          goto switchD_001039b9_caseD_0;
          bVar17 = true;
          uVar11 = 1;
          while ((((0x3b < bVar1 - 0x22 ||
                   ((0xe000000430020c1U >> ((ulong)(bVar1 - 0x22) & 0x3f) & 1) == 0)) &&
                  (bVar1 != 0x7b)) && (bVar1 != 0x7d))) {
            bVar17 = uVar11 < uVar14;
            bVar18 = uVar6 == 0;
            uVar6 = uVar6 - 1;
            if (((bVar18) || (bVar1 = __s2[uVar11], (byte)(bVar1 + 0x81) < 0xa2)) ||
               (uVar11 = uVar11 + 1, (bVar1 & 0x7c) == 0x3c)) break;
          }
          if (bVar17) goto switchD_001039b9_caseD_0;
        }
        p_Var4 = pcVar2[1].on_body;
        if (p_Var4 != (cio_http_data_cb_t)0x0) {
          p_Var15 = (cio_http_data_cb_t)0x0;
          do {
            __s = *(char **)(p_Var3 + (long)p_Var15 * 8);
            sVar7 = strlen(__s);
            if ((uVar14 == sVar7) && (iVar5 = bcmp(__s,__s2,uVar14), iVar5 == 0)) {
              *(int *)((long)&pcVar2[1].on_message_complete + 4) = (int)p_Var15;
              cVar9 = CIO_HTTP_CB_SUCCESS;
              goto switchD_001039b9_caseD_0;
            }
            p_Var15 = (cio_http_data_cb_t)(ulong)((int)p_Var15 + 1);
          } while (p_Var15 < p_Var4);
        }
        at = (char *)((byte *)at + uVar12 + 1);
        length = sVar8 + ~uVar12;
        bVar17 = pbVar16 == (byte *)0x0;
        pbVar16 = (byte *)at;
        sVar8 = length;
        if (bVar17) goto switchD_001039b9_caseD_0;
      } while( true );
    }
  }
  cVar9 = CIO_HTTP_CB_SUCCESS;
switchD_001039b9_caseD_0:
  *(byte *)&pcVar2[1].on_message_complete = bVar13 & 0xfc;
  return cVar9;
}

Assistant:

static enum cio_http_cb_return handle_field_value(struct cio_http_client *client, const char *at, size_t length)
{
	enum cio_http_cb_return ret = CIO_HTTP_CB_SUCCESS;

	struct cio_websocket_location_handler *wslh = cio_container_of(client->current_handler, struct cio_websocket_location_handler, http_location);

	uint_fast8_t header_field = (uint_fast8_t)wslh->flags.current_header_field;

	switch (header_field) {
	case CIO_WS_HEADER_SEC_WEBSOCKET_KEY:
		ret = save_websocket_key(wslh, at, length);
		break;

	case CIO_WS_HEADER_SEC_WEBSOCKET_VERSION:
		ret = check_websocket_version(wslh, at, length);
		break;

	case CIO_WS_HEADER_SEC_WEBSOCKET_PROTOCOL:
		wslh->flags.subprotocol_requested = 1;
		ret = check_websocket_protocol(wslh, at, length);
		break;

	default:
		break;
	}

	wslh->flags.current_header_field = CIO_WS_HEADER_UNKNOWN;
	return ret;
}